

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_79cbb::ParserImpl::ParseBlock(ParserImpl *this)

{
  TokenDetail *t;
  int iVar1;
  int iVar2;
  long *plVar3;
  String *pSVar4;
  char *pcVar5;
  undefined8 uVar6;
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail op_01;
  TokenDetail op_02;
  TokenDetail op_03;
  TokenDetail op_04;
  GCObject *pGVar7;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> uVar8;
  TokenDetail *pTVar9;
  _Manager_type p_Var10;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar11;
  GCObject *pGVar12;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar13;
  ParseException *pPVar14;
  ParserImpl *in_RSI;
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> _Var15;
  bool bVar16;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_180;
  TokenDetail name;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_list;
  int iStack_13c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp1;
  PrefixExpType type;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_120;
  String *local_118;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aaStack_110 [2];
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_100;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_f0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_e8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_e0;
  undefined1 local_d8 [32];
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp2;
  
  local_e0.str_ = (String *)operator_new(0x28);
  ((local_e0.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__Block_00198e28;
  ((local_e0.str_)->super_GCObject).next_ = (GCObject *)0x0;
  *(undefined8 *)
   &(((CharInStream *)&((local_e0.str_)->super_GCObject).field_0x10)->super__Function_base).
    _M_functor = 0;
  ((local_e0.str_)->field_1).str_ = (char *)0x0;
  *(_Manager_type *)((long)&(local_e0.str_)->field_1 + 8) = (_Manager_type)0x0;
  pGVar7 = &(local_e0.str_)->super_GCObject;
  t = &in_RSI->current_;
  bVar16 = false;
LAB_0015e34a:
  pTVar9 = LookAhead(in_RSI);
  if ((((pTVar9->token_ == 0x11e) || (pTVar9 = LookAhead(in_RSI), pTVar9->token_ == 0x105)) ||
      (pTVar9 = LookAhead(in_RSI), pTVar9->token_ == 0x113)) ||
     ((pTVar9 = LookAhead(in_RSI), pTVar9->token_ == 0x104 ||
      (pTVar9 = LookAhead(in_RSI), pTVar9->token_ == 0x103)))) {
    this->lexer_ = (Lexer *)local_e0;
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           this;
  }
  if (bVar16) {
    pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar14,"unexpect statement after return statement",&in_RSI->look_ahead_);
    __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  pTVar9 = LookAhead(in_RSI);
  bVar16 = pTVar9->token_ == 0x110;
  if (bVar16) {
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x110) {
      __assert_fail("current_.token_ == Token_Return",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0xe0,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseReturnStatement()"
                   );
    }
    p_Var10 = (_Manager_type)operator_new(0x18);
    iVar1 = (in_RSI->current_).line_;
    *(undefined ***)p_Var10 = &PTR__ReturnStatement_00198e68;
    *(undefined8 *)(p_Var10 + 8) = 0;
    *(int *)(p_Var10 + 0x10) = iVar1;
    *(undefined4 *)(p_Var10 + 0x14) = 0;
    pTVar9 = LookAhead(in_RSI);
    if (((pTVar9->token_ != 0x11e) && (pTVar9 = LookAhead(in_RSI), pTVar9->token_ != 0x105)) &&
       ((pTVar9 = LookAhead(in_RSI), pTVar9->token_ != 0x113 &&
        ((pTVar9 = LookAhead(in_RSI), pTVar9->token_ != 0x104 &&
         (pTVar9 = LookAhead(in_RSI), pTVar9->token_ != 0x103)))))) {
      pTVar9 = LookAhead(in_RSI);
      if (pTVar9->token_ != 0x3b) {
        ParseExpList((ParserImpl *)&name);
        plVar3 = *(long **)(p_Var10 + 8);
        *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(p_Var10 + 8) = name.field_0;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
      }
      pTVar9 = LookAhead(in_RSI);
      if (pTVar9->token_ == 0x3b) {
        NextToken(in_RSI);
      }
    }
    aVar11 = (anon_union_8_2_010d16d7_for_TokenDetail_0)
             ((anon_union_8_2_010d16d7_for_TokenDetail_0 *)((long)&(local_e0.str_)->field_1 + 8))->
             str_;
    *(_Manager_type *)((long)&(local_e0.str_)->field_1 + 8) = p_Var10;
  }
  else {
    pTVar9 = LookAhead(in_RSI);
    switch(pTVar9->token_) {
    case 0x101:
      aVar11.str_ = (String *)operator_new(0x30);
      pTVar9 = NextToken(in_RSI);
      ((aVar11.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__SyntaxTree_00198ea8;
      pSVar4 = pTVar9->module_;
      pcVar5 = *(char **)&pTVar9->line_;
      uVar6 = *(undefined8 *)&pTVar9->token_;
      ((aVar11.str_)->super_GCObject).next_ = (GCObject *)pTVar9->field_0;
      *(String **)&((aVar11.str_)->super_GCObject).field_0x10 = pSVar4;
      ((aVar11.str_)->field_1).str_ = pcVar5;
      *(undefined8 *)((long)&(aVar11.str_)->field_1 + 8) = uVar6;
      *(undefined8 *)&(aVar11.str_)->length_ = 0;
      local_180.str_ = aVar11.str_;
      break;
    case 0x102:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x102) {
        __assert_fail("current_.token_ == Token_Do",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x11c,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseDoStatement()"
                     );
      }
      ParseBlock((ParserImpl *)&name);
      pTVar9 = NextToken(in_RSI);
      if (pTVar9->token_ != 0x105) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'end\' for do-statement",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_180.str_ = (String *)operator_new(0x10);
      ((local_180.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__DoStatement_00198ee8;
      ((local_180.str_)->super_GCObject).next_ = (GCObject *)name.field_0;
      break;
    case 0x103:
    case 0x104:
    case 0x105:
    case 0x106:
    case 0x10a:
    case 0x10c:
    case 0x10d:
    case 0x10e:
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
switchD_0015e4f5_caseD_103:
      pTVar9 = LookAhead(in_RSI);
      iVar1 = pTVar9->line_;
      ParsePrefixExp((ParserImpl *)&name,(PrefixExpType *)in_RSI);
      if (type == PrefixExpType_Functioncall) {
        local_180 = name.field_0;
      }
      else {
        if (type != PrefixExpType_Var) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"incomplete statement",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        pGVar12 = (GCObject *)operator_new(0x20);
        pGVar12->_vptr_GCObject = (_func_int **)&PTR__VarList_00199228;
        pGVar12->next_ = (GCObject *)0x0;
        *(undefined8 *)&pGVar12->field_0x10 = 0;
        pGVar12[1]._vptr_GCObject = (_func_int **)0x0;
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                    *)&pGVar12->next_,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&name);
        while (pTVar9 = LookAhead(in_RSI), pTVar9->token_ != 0x3d) {
          pTVar9 = LookAhead(in_RSI);
          if (pTVar9->token_ != 0x2c) {
            pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException
                      (pPVar14,"expect \',\' to split var",&in_RSI->look_ahead_);
LAB_0015f057:
            __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          NextToken(in_RSI);
          ParsePrefixExp((ParserImpl *)&exp_list,(PrefixExpType *)in_RSI);
          uVar8 = exp_list;
          aVar11 = name.field_0;
          exp_list._M_t.
          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
               (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
               )(__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0;
          name.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)
                         uVar8._M_t.
                         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                         .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
          if ((aVar11.str_ != (String *)0x0) &&
             ((*((aVar11.str_)->super_GCObject)._vptr_GCObject[1])(),
             (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
             exp_list._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0)) {
            (**(code **)(*(long *)exp_list._M_t.
                                  super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8
                        ))();
          }
          if (type != PrefixExpType_Var) {
            pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar14,"expect var here",t);
            goto LAB_0015f057;
          }
          std::
          vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
          ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                    ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                      *)&pGVar12->next_,
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&name);
        }
        NextToken(in_RSI);
        ParseExpList((ParserImpl *)&exp_list);
        local_180.str_ = (String *)operator_new(0x28);
        ((local_180.str_)->super_GCObject)._vptr_GCObject =
             (_func_int **)&PTR__AssignmentStatement_001991e8;
        ((local_180.str_)->super_GCObject).next_ = pGVar12;
        *(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
         &((local_180.str_)->super_GCObject).field_0x10 =
             exp_list._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        *(int *)&(local_180.str_)->field_1 = iVar1;
        *(undefined8 *)((long)&(local_180.str_)->field_1 + 8) = 0;
        if (name.field_0.str_ == (String *)0x0) break;
        (*((name.field_0.str_)->super_GCObject)._vptr_GCObject[1])();
      }
      if (local_180.str_ == (String *)0x0) goto LAB_0015e34a;
      break;
    case 0x107:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x107) {
        __assert_fail("current_.token_ == Token_For",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x1bb,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseForStatement()"
                     );
      }
      pTVar9 = LookAhead(in_RSI);
      if (pTVar9->token_ != 0x115) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar14,"expect \'id\' after \'for\'",&in_RSI->look_ahead_);
LAB_0015f40d:
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      pTVar9 = LookAhead2(in_RSI);
      if (pTVar9->token_ == 0x3d) {
        paVar13 = &NextToken(in_RSI)->field_0;
        name.field_0 = *paVar13;
        name.module_ = paVar13[1].str_;
        name._16_8_ = paVar13[2];
        name._24_8_ = paVar13[3];
        if ((in_RSI->current_).token_ != 0x115) {
          __assert_fail("current_.token_ == Token_Id",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x1c9,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                       );
        }
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x3d) {
          __assert_fail("current_.token_ == \'=\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x1cc,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                       );
        }
        local_e8.number_ = 0.0;
        exp_list._M_t.
        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0;
        op_01._28_4_ = iStack_13c;
        op_01.token_ = 0x11e;
        op_01.line_ = 0;
        op_01.column_ = 0;
        op_01.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_01.module_ = (String *)0x0;
        ParseExp((ParserImpl *)&exp1,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_01,(int)&local_e8);
        if (local_e8.str_ != (String *)0x0) {
          (*((local_e8.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        local_e8.number_ = 0.0;
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x2c) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \',\' in numeric-for",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        local_f0.number_ = 0.0;
        _type = 0.0;
        aStack_120.number_ = 0.0;
        local_118 = (String *)0x0;
        aaStack_110[0]._0_4_ = 0x11e;
        op_02._28_4_ = aaStack_110[0]._4_4_;
        op_02.token_ = 0x11e;
        op_02.line_ = 0;
        op_02.column_ = 0;
        op_02.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_02.module_ = (String *)0x0;
        ParseExp((ParserImpl *)&exp2,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_02,(int)&local_f0);
        if (local_f0.str_ != (String *)0x0) {
          (*((local_f0.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        local_f0.number_ = 0.0;
        pTVar9 = LookAhead(in_RSI);
        if (pTVar9->token_ == 0x2c) {
          NextToken(in_RSI);
          local_100.number_ = 0.0;
          local_d8._0_8_ = (Lexer *)0x0;
          local_d8._8_8_ = 0.0;
          local_d8._16_8_ = (String *)0x0;
          local_d8._24_4_ = 0x11e;
          op_03._28_4_ = local_d8._28_4_;
          op_03.token_ = 0x11e;
          op_03.line_ = 0;
          op_03.column_ = 0;
          op_03.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
          op_03.module_ = (String *)0x0;
          ParseExp((ParserImpl *)&block,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                   op_03,(int)&local_100);
          _Var15._M_t.
          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
               (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
               (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)block;
          if (local_100.str_ != (String *)0x0) {
            (*((local_100.str_)->super_GCObject)._vptr_GCObject[1])();
          }
          local_100.number_ = 0.0;
        }
        else {
          _Var15._M_t.
          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
               (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
               (_Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)0x0;
        }
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x102) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \'do\' to start numeric-for body",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        ParseBlock((ParserImpl *)&block);
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x105) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \'end\' to complete numeric-for",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        local_180.str_ = (String *)operator_new(0x48);
        ((local_180.str_)->super_GCObject)._vptr_GCObject =
             (_func_int **)&PTR__NumericForStatement_00199068;
        ((local_180.str_)->super_GCObject).next_ = (GCObject *)name.field_0;
        *(String **)&((local_180.str_)->super_GCObject).field_0x10 = name.module_;
        ((local_180.str_)->field_1).str_ = (char *)name._16_8_;
        *(undefined8 *)((long)&(local_180.str_)->field_1 + 8) = name._24_8_;
        *(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
         &(local_180.str_)->length_ =
             exp1._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        (local_180.str_)->hash_ =
             (size_t)exp2._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        local_180.str_[1].super_GCObject._vptr_GCObject =
             (_func_int **)
             _Var15._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        local_180.str_[1].super_GCObject.next_ =
             (GCObject *)
             block._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      else {
        pTVar9 = LookAhead(in_RSI);
        iVar1 = pTVar9->line_;
        ParseNameList((ParserImpl *)&name);
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x10a) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \'in\' in generic-for",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        ParseExpList((ParserImpl *)&exp_list);
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x102) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \'do\' to start generic-for body",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        ParseBlock((ParserImpl *)&type);
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x105) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \'end\' to complete generic-for",t);
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        local_180.str_ = (String *)operator_new(0x28);
        ((local_180.str_)->super_GCObject)._vptr_GCObject =
             (_func_int **)&PTR__GenericForStatement_001990a8;
        ((local_180.str_)->super_GCObject).next_ = (GCObject *)name.field_0;
        *(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
         &((local_180.str_)->super_GCObject).field_0x10 =
             exp_list._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        ((local_180.str_)->field_1).str_ = (char *)_type;
        *(int *)((long)&(local_180.str_)->field_1 + 8) = iVar1;
      }
      break;
    case 0x108:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x108) {
        __assert_fail("current_.token_ == Token_Function",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x195,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionStatement()"
                     );
      }
      pTVar9 = NextToken(in_RSI);
      if (pTVar9->token_ != 0x115) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"unexpect token after \'function\'",t);
        goto LAB_0015f40d;
      }
      pGVar12 = (GCObject *)operator_new(0x48);
      pGVar12->_vptr_GCObject = (_func_int **)&PTR__FunctionName_00199128;
      pGVar12->next_ = (GCObject *)0x0;
      *(undefined8 *)&pGVar12->field_0x10 = 0;
      pGVar12[1]._vptr_GCObject = (_func_int **)0x0;
      pGVar12[1].next_ = (GCObject *)0x0;
      *(undefined8 *)&pGVar12[1].field_0x10 = 0;
      pGVar12[2]._vptr_GCObject = (_func_int **)0x0;
      *(undefined4 *)&pGVar12[2].next_ = 0x11e;
      *(undefined4 *)&pGVar12[2].field_0x10 = 0;
      std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
                ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)&pGVar12->next_,t)
      ;
      while (pTVar9 = LookAhead(in_RSI), pTVar9->token_ == 0x2e) {
        NextToken(in_RSI);
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x115) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException
                    (pPVar14,"unexpect token in function name after \'.\'",t);
          goto LAB_0015efca;
        }
        std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
                  ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)&pGVar12->next_,
                   t);
      }
      pTVar9 = LookAhead(in_RSI);
      if (pTVar9->token_ == 0x3a) {
        NextToken(in_RSI);
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x115) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException
                    (pPVar14,"unexpect token in function name after \':\'",t);
LAB_0015efca:
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        aVar11 = t->field_0;
        pSVar4 = (in_RSI->current_).module_;
        uVar6 = *(undefined8 *)&(in_RSI->current_).column_;
        *(undefined8 *)&pGVar12[1].field_0x14 =
             *(undefined8 *)((long)&(in_RSI->current_).module_ + 4);
        *(undefined8 *)((long)&pGVar12[2]._vptr_GCObject + 4) = uVar6;
        pGVar12[1].next_ = (GCObject *)aVar11;
        *(String **)&pGVar12[1].field_0x10 = pSVar4;
      }
      ParseFunctionBody((ParserImpl *)&name);
      local_180.str_ = (String *)operator_new(0x18);
      ((local_180.str_)->super_GCObject)._vptr_GCObject =
           (_func_int **)&PTR__FunctionStatement_001990e8;
      ((local_180.str_)->super_GCObject).next_ = pGVar12;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_180.str_)->super_GCObject).field_0x10 =
           name.field_0;
      break;
    case 0x109:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x109) {
        __assert_fail("current_.token_ == Token_If",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x151,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseIfStatement()"
                     );
      }
      iVar1 = (in_RSI->current_).line_;
      _type = 0.0;
      name.field_0.number_ = 0.0;
      name.module_ = (String *)0x0;
      name.line_ = 0;
      name.column_ = 0;
      name.token_ = 0x11e;
      op_04.line_ = 0;
      op_04.column_ = 0;
      op_04.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op_04.module_ = (String *)0x0;
      op_04.token_ = 0x11e;
      op_04._28_4_ = name._28_4_;
      ParseExp((ParserImpl *)&exp_list,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_04,
               (int)&type);
      if ((Lexer *)_type != (Lexer *)0x0) {
        (*(_type->super_GCObject)._vptr_GCObject[1])();
      }
      pTVar9 = NextToken(in_RSI);
      if (pTVar9->token_ != 0x111) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'then\' for if",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      ParseBlock((ParserImpl *)local_d8);
      pTVar9 = LookAhead(in_RSI);
      iVar2 = pTVar9->line_;
      ParseFalseBranchStatement((ParserImpl *)&exp1);
      local_180.str_ = (String *)operator_new(0x28);
      ((local_180.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__IfStatement_00198fa8;
      ((local_180.str_)->super_GCObject).next_ =
           (GCObject *)
           exp_list._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(undefined8 *)&((local_180.str_)->super_GCObject).field_0x10 = local_d8._0_8_;
      ((local_180.str_)->field_1).str_ =
           (char *)exp1._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(int *)((long)&(local_180.str_)->field_1 + 8) = iVar1;
      *(int *)((long)&(local_180.str_)->field_1 + 0xc) = iVar2;
      break;
    case 0x10b:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x10b) {
        __assert_fail("current_.token_ == Token_Local",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x200,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalStatement()"
                     );
      }
      pTVar9 = LookAhead(in_RSI);
      if (pTVar9->token_ == 0x108) {
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x108) {
          __assert_fail("current_.token_ == Token_Function",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x210,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalFunction()"
                       );
        }
        pTVar9 = NextToken(in_RSI);
        if (pTVar9->token_ != 0x115) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \'id\' after \'local function\'",t);
          goto LAB_0015f40d;
        }
        name.field_0 = t->field_0;
        name.module_ = (in_RSI->current_).module_;
        name.line_ = (in_RSI->current_).line_;
        name.column_ = (in_RSI->current_).column_;
        name.token_ = (in_RSI->current_).token_;
        name._28_4_ = *(undefined4 *)&(in_RSI->current_).field_0x1c;
        ParseFunctionBody((ParserImpl *)&exp_list);
        local_180.str_ = (String *)operator_new(0x30);
        ((local_180.str_)->super_GCObject)._vptr_GCObject =
             (_func_int **)&PTR__LocalFunctionStatement_00199168;
        ((local_180.str_)->super_GCObject).next_ = (GCObject *)name.field_0;
        *(String **)&((local_180.str_)->super_GCObject).field_0x10 = name.module_;
        ((local_180.str_)->field_1).str_ = (char *)name._16_8_;
        *(undefined8 *)((long)&(local_180.str_)->field_1 + 8) = name._24_8_;
        *(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
         &(local_180.str_)->length_ =
             exp_list._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      else {
        pTVar9 = LookAhead(in_RSI);
        if (pTVar9->token_ != 0x115) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException
                    (pPVar14,"unexpect token after \'local\'",&in_RSI->look_ahead_);
          goto LAB_0015f40d;
        }
        pTVar9 = LookAhead(in_RSI);
        iVar1 = pTVar9->line_;
        ParseNameList((ParserImpl *)&name);
        pTVar9 = LookAhead(in_RSI);
        if (pTVar9->token_ == 0x3d) {
          NextToken(in_RSI);
          ParseExpList((ParserImpl *)&exp_list);
          _Var15._M_t.
          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
               (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
               (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)exp_list;
        }
        else {
          _Var15._M_t.
          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
               (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
               (_Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)0x0;
        }
        local_180.str_ = (String *)operator_new(0x28);
        ((local_180.str_)->super_GCObject)._vptr_GCObject =
             (_func_int **)&PTR__LocalNameListStatement_001991a8;
        ((local_180.str_)->super_GCObject).next_ = (GCObject *)name.field_0;
        *(tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> *)
         &((local_180.str_)->super_GCObject).field_0x10 =
             _Var15._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        *(int *)&(local_180.str_)->field_1 = iVar1;
        *(undefined8 *)((long)&(local_180.str_)->field_1 + 8) = 0;
      }
      break;
    case 0x10f:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x10f) {
        __assert_fail("current_.token_ == Token_Repeat",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x13f,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseRepeatStatement()"
                     );
      }
      ParseBlock((ParserImpl *)&exp_list);
      pTVar9 = NextToken(in_RSI);
      if (pTVar9->token_ != 0x113) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'until\' for repeat-statement",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      iVar1 = (in_RSI->current_).line_;
      local_d8._0_8_ = (Lexer *)0x0;
      name.field_0.number_ = 0.0;
      name.module_ = (String *)0x0;
      name.line_ = 0;
      name.column_ = 0;
      name.token_ = 0x11e;
      op_00.line_ = 0;
      op_00.column_ = 0;
      op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op_00.module_ = (String *)0x0;
      op_00.token_ = 0x11e;
      op_00._28_4_ = name._28_4_;
      ParseExp((ParserImpl *)&type,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_00,
               (int)local_d8);
      if ((Lexer *)local_d8._0_8_ != (Lexer *)0x0) {
        (*(code *)((*(State **)local_d8._0_8_)->string_pool_)._M_t.
                  super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>
                  .super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
      }
      local_180.str_ = (String *)operator_new(0x20);
      ((local_180.str_)->super_GCObject)._vptr_GCObject =
           (_func_int **)&PTR__RepeatStatement_00198f68;
      ((local_180.str_)->super_GCObject).next_ =
           (GCObject *)
           exp_list._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_180.str_)->super_GCObject).field_0x10 =
           _type;
      *(int *)&(local_180.str_)->field_1 = iVar1;
      break;
    case 0x114:
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x114) {
        __assert_fail("current_.token_ == Token_While",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x128,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseWhileStatement()"
                     );
      }
      iVar1 = (in_RSI->current_).line_;
      _type = 0.0;
      name.field_0.number_ = 0.0;
      name.module_ = (String *)0x0;
      name.line_ = 0;
      name.column_ = 0;
      name.token_ = 0x11e;
      op.line_ = 0;
      op.column_ = 0;
      op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op.module_ = (String *)0x0;
      op.token_ = 0x11e;
      op._28_4_ = name._28_4_;
      ParseExp((ParserImpl *)&exp_list,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
               (int)&type);
      if ((Lexer *)_type != (Lexer *)0x0) {
        (*(_type->super_GCObject)._vptr_GCObject[1])();
      }
      pTVar9 = NextToken(in_RSI);
      if (pTVar9->token_ != 0x102) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'do\' for while-statement",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      ParseBlock((ParserImpl *)local_d8);
      pTVar9 = NextToken(in_RSI);
      if (pTVar9->token_ != 0x105) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'end\' for while-statement",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      iVar2 = (in_RSI->current_).line_;
      local_180.str_ = (String *)operator_new(0x20);
      ((local_180.str_)->super_GCObject)._vptr_GCObject =
           (_func_int **)&PTR__WhileStatement_00198f28;
      ((local_180.str_)->super_GCObject).next_ =
           (GCObject *)
           exp_list._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(undefined8 *)&((local_180.str_)->super_GCObject).field_0x10 = local_d8._0_8_;
      *(int *)&(local_180.str_)->field_1 = iVar1;
      *(int *)((long)&(local_180.str_)->field_1 + 4) = iVar2;
      break;
    default:
      if (pTVar9->token_ != 0x3b) goto switchD_0015e4f5_caseD_103;
      NextToken(in_RSI);
      goto LAB_0015e34a;
    }
    std::
    vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
    ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
              ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                *)&pGVar7->next_,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&local_180);
    aVar11 = local_180;
  }
  if (aVar11.str_ != (String *)0x0) {
    (*((aVar11.str_)->super_GCObject)._vptr_GCObject[1])();
  }
  goto LAB_0015e34a;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseBlock()
        {
            std::unique_ptr<Block> block(new Block);

            bool has_return = false;
            while (LookAhead().token_ != Token_EOF &&
                   LookAhead().token_ != Token_End &&
                   LookAhead().token_ != Token_Until &&
                   LookAhead().token_ != Token_Elseif &&
                   LookAhead().token_ != Token_Else)
            {
                if (has_return)
                    throw ParseException("unexpect statement after return statement", look_ahead_);

                if (LookAhead().token_ == Token_Return)
                {
                    block->return_stmt_ = ParseReturnStatement();
                    has_return = true;
                }
                else
                {
                    std::unique_ptr<SyntaxTree> statement = ParseStatement();
                    if (statement)
                        block->statements_.push_back(std::move(statement));
                }
            }

            return std::move(block);
        }